

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

MemoryStreamReaderPtr __thiscall
Assimp::Ogre::OgreBinarySerializer::OpenReader
          (OgreBinarySerializer *this,IOSystem *pIOHandler,string *filename)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  StreamReader<false,_false> *this_00;
  Logger *pLVar3;
  DeadlyImportError *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  MemoryStreamReaderPtr MVar5;
  char *local_1c0 [4];
  string local_1a0 [11];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a0,".skeleton",(allocator<char> *)local_1c0);
  bVar1 = EndsWith(filename,local_1a0,false);
  std::__cxx11::string::~string((string *)local_1a0);
  if (bVar1) {
    iVar2 = (*pIOHandler->_vptr_IOSystem[2])(pIOHandler,(filename->_M_dataplus)._M_p);
    if ((char)iVar2 != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a0,"rb",(allocator<char> *)local_1c0);
      iVar2 = (*pIOHandler->_vptr_IOSystem[4])
                        (pIOHandler,(filename->_M_dataplus)._M_p,local_1a0[0]._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)local_1a0);
      if ((IOStream *)CONCAT44(extraout_var,iVar2) == (IOStream *)0x0) {
        this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(local_1a0,"Failed to open skeleton file ",filename);
        DeadlyImportError::DeadlyImportError(this_01,local_1a0);
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      this_00 = (StreamReader<false,_false> *)operator_new(0x38);
      StreamReader<false,_false>::StreamReader
                (this_00,(IOStream *)CONCAT44(extraout_var,iVar2),false);
      std::__shared_ptr<Assimp::StreamReader<false,false>,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Assimp::StreamReader<false,false>,void>
                ((__shared_ptr<Assimp::StreamReader<false,false>,(__gnu_cxx::_Lock_policy)2> *)this,
                 this_00);
      _Var4._M_pi = extraout_RDX;
      goto LAB_00446273;
    }
    pLVar3 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[31]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
               (char (*) [31])"Failed to find skeleton file \'");
    std::operator<<((ostream *)local_1a0,(string *)filename);
    std::operator<<((ostream *)local_1a0,"\' that is referenced by imported Mesh.");
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar3,local_1c0[0]);
  }
  else {
    pLVar3 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[46]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
               (char (*) [46])"Imported Mesh is referencing to unsupported \'");
    std::operator<<((ostream *)local_1a0,(string *)filename);
    std::operator<<((ostream *)local_1a0,"\' skeleton file.");
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar3,local_1c0[0]);
  }
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  *(undefined8 *)this = 0;
  this->m_reader = (MemoryStreamReader *)0x0;
  _Var4._M_pi = extraout_RDX_00;
LAB_00446273:
  MVar5.super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  MVar5.super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MemoryStreamReaderPtr)
         MVar5.super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MemoryStreamReaderPtr OgreBinarySerializer::OpenReader(Assimp::IOSystem *pIOHandler, const std::string &filename)
{
    if (!EndsWith(filename, ".skeleton", false))
    {
        ASSIMP_LOG_ERROR_F("Imported Mesh is referencing to unsupported '", filename, "' skeleton file.");
        return MemoryStreamReaderPtr();
    }

    if (!pIOHandler->Exists(filename))
    {
        ASSIMP_LOG_ERROR_F("Failed to find skeleton file '", filename, "' that is referenced by imported Mesh.");
        return MemoryStreamReaderPtr();
    }

    IOStream *f = pIOHandler->Open(filename, "rb");
    if (!f) {
        throw DeadlyImportError("Failed to open skeleton file " + filename);
    }

    return MemoryStreamReaderPtr(new MemoryStreamReader(f));
}